

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

CPAccessResult access_pauth(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  int iVar1;
  int iVar2;
  uint64_t uVar3;
  int el;
  _Bool isread_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  iVar1 = arm_current_el(env);
  if (((iVar1 < 2) && (iVar2 = arm_feature(env,0x20), iVar2 != 0)) &&
     (uVar3 = arm_hcr_el2_eff_aarch64(env), (uVar3 & 0x10000000000) == 0)) {
    return CP_ACCESS_TRAP_EL2;
  }
  if (((iVar1 < 3) && (iVar1 = arm_feature(env,0x21), iVar1 != 0)) &&
     (((env->cp15).scr_el3 & 0x10000) == 0)) {
    return CP_ACCESS_TRAP_EL3;
  }
  return CP_ACCESS_OK;
}

Assistant:

static CPAccessResult access_pauth(CPUARMState *env, const ARMCPRegInfo *ri,
                                   bool isread)
{
    int el = arm_current_el(env);

    if (el < 2 &&
        arm_feature(env, ARM_FEATURE_EL2) &&
        !(arm_hcr_el2_eff(env) & HCR_APK)) {
        return CP_ACCESS_TRAP_EL2;
    }
    if (el < 3 &&
        arm_feature(env, ARM_FEATURE_EL3) &&
        !(env->cp15.scr_el3 & SCR_APK)) {
        return CP_ACCESS_TRAP_EL3;
    }
    return CP_ACCESS_OK;
}